

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layer.cpp
# Opt level: O2

void __thiscall Layer::compile(Layer *this,uint row)

{
  (this->m_shape).n_row = row;
  Matrix<double>::reshape(&this->m_inputs,1,(this->m_shape).n_col);
  Matrix<double>::reshape(&this->m_outputs,1,row);
  Matrix<double>::reshape(&this->m_weights,&this->m_shape);
  Matrix<double>::initialize(&this->m_weights,1.0,2.0);
  return;
}

Assistant:

void Layer::compile(unsigned row){
    m_shape.n_row=row;

    m_inputs.reshape(1, m_shape.n_col);
    m_outputs.reshape(1, row);
    m_weights.reshape(m_shape);

    m_weights.initialize(1, 2);
}